

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O2

void __thiscall Imf_3_2::SampleCountChannel::endEdit(SampleCountChannel *this)

{
  uint *puVar1;
  uint *puVar2;
  size_t *psVar3;
  uint uVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  
  this->_totalNumSamples = 0;
  this->_totalSamplesOccupied = 0;
  puVar1 = this->_numSamples;
  puVar2 = this->_sampleListSizes;
  psVar3 = this->_sampleListPositions;
  uVar6 = 0;
  for (uVar5 = 0; uVar5 < (this->super_ImageChannel)._numPixels; uVar5 = uVar5 + 1) {
    uVar4 = anon_unknown_6::roundListSizeUp(puVar1[uVar5]);
    puVar2[uVar5] = uVar4;
    psVar3[uVar5] = uVar6;
    this->_totalNumSamples = this->_totalNumSamples + (ulong)puVar1[uVar5];
    uVar6 = (ulong)uVar4 + this->_totalSamplesOccupied;
    this->_totalSamplesOccupied = uVar6;
  }
  this->_sampleBufferSize = (uVar6 >> 1) + uVar6;
  DeepImageLevel::initializeSampleLists((DeepImageLevel *)(this->super_ImageChannel)._level);
  return;
}

Assistant:

void
SampleCountChannel::endEdit ()
{
    try
    {
        _totalNumSamples      = 0;
        _totalSamplesOccupied = 0;

        for (size_t i = 0; i < numPixels (); ++i)
        {
            _sampleListSizes[i]     = roundListSizeUp (_numSamples[i]);
            _sampleListPositions[i] = _totalSamplesOccupied;
            _totalNumSamples += _numSamples[i];
            _totalSamplesOccupied += _sampleListSizes[i];
        }

        _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);

        deepLevel ().initializeSampleLists ();
    }
    catch (...)
    {
        level ().image ().resize (Box2i (V2i (0, 0), V2i (-1, -1)));
        throw;
    }
}